

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O0

result * __thiscall
lest::expression_lhs<nonstd::sv_lite::basic_string_view<char,std::char_traits<char>>const&>::
operator>(result *__return_storage_ptr__,
         expression_lhs<nonstd::sv_lite::basic_string_view<char,std::char_traits<char>>const&> *this
         ,basic_string_view<char,_std::char_traits<char>_> *rhs)

{
  basic_string_view<char,_std::char_traits<char>_> *pbVar1;
  lest *this_00;
  basic_string_view<char,_std::char_traits<char>_> *in_R8;
  allocator local_f9;
  string local_f8 [32];
  basic_string_view<char,_std::char_traits<char>_> local_d8 [2];
  string local_b8;
  text local_98;
  const_pointer local_78;
  size_type sStack_70;
  const_pointer local_68;
  size_type sStack_60;
  bool local_49;
  result local_48;
  string *local_20;
  basic_string_view<char,_std::char_traits<char>_> *rhs_local;
  expression_lhs<const_nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>_&>
  *this_local;
  
  pbVar1 = *(basic_string_view<char,_std::char_traits<char>_> **)this;
  local_68 = pbVar1->data_;
  sStack_60 = pbVar1->size_;
  local_78 = rhs->data_;
  sStack_70 = rhs->size_;
  local_20 = (string *)rhs;
  rhs_local = (basic_string_view<char,_std::char_traits<char>_> *)this;
  this_local = (expression_lhs<const_nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>_&>
                *)__return_storage_ptr__;
  local_49 = nonstd::sv_lite::operator>(*pbVar1,*rhs);
  this_00 = *(lest **)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f8,">",&local_f9);
  std::__cxx11::string::string((string *)local_d8,local_f8);
  to_string<nonstd::sv_lite::basic_string_view<char,std::char_traits<char>>,nonstd::sv_lite::basic_string_view<char,std::char_traits<char>>>
            (&local_b8,this_00,local_d8,local_20,in_R8);
  std::__cxx11::string::string((string *)&local_98,(string *)&local_b8);
  result::result<bool>(&local_48,&local_49,&local_98);
  result::result(__return_storage_ptr__,&local_48);
  result::~result(&local_48);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)local_d8);
  std::__cxx11::string::~string(local_f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_f9);
  return __return_storage_ptr__;
}

Assistant:

result operator<=( R const & rhs ) { return result( lhs <= rhs, to_string( lhs, "<=", rhs ) ); }